

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

idx_t duckdb::BinaryExecutor::SelectFlatLoop<int,int,duckdb::GreaterThan,true,false,true,true>
                (int *ldata,int *rdata,SelectionVector *sel,idx_t count,ValidityMask *validity_mask,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  int iVar1;
  int iVar2;
  unsigned_long *puVar3;
  ulong uVar4;
  idx_t iVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  
  puVar3 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  uVar7 = 0;
  lVar10 = 0;
  iVar5 = 0;
  uVar11 = 0;
  do {
    if (uVar7 == count + 0x3f >> 6) {
      return iVar5;
    }
    if (puVar3 == (unsigned_long *)0x0) {
      uVar9 = uVar11 + 0x40;
      if (count <= uVar11 + 0x40) {
        uVar9 = count;
      }
LAB_003b2ed7:
      while (uVar12 = uVar11, uVar12 < uVar9) {
        uVar11 = uVar12;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar11 = (ulong)sel->sel_vector[uVar12];
        }
        iVar2 = *ldata;
        iVar1 = rdata[uVar12];
        true_sel->sel_vector[iVar5] = (sel_t)uVar11;
        iVar5 = iVar5 + (iVar1 < iVar2);
        false_sel->sel_vector[lVar10] = (sel_t)uVar11;
        lVar10 = lVar10 + (ulong)(iVar2 <= iVar1);
        uVar11 = uVar12 + 1;
      }
    }
    else {
      uVar4 = puVar3[uVar7];
      uVar12 = uVar11 + 0x40;
      if (count <= uVar11 + 0x40) {
        uVar12 = count;
      }
      uVar9 = uVar12;
      if (uVar4 == 0xffffffffffffffff) goto LAB_003b2ed7;
      if (uVar4 == 0) {
        for (; uVar11 < uVar12; uVar11 = uVar11 + 1) {
          uVar9 = uVar11;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar9 = (ulong)sel->sel_vector[uVar11];
          }
          false_sel->sel_vector[lVar10] = (sel_t)uVar9;
          lVar10 = lVar10 + 1;
        }
      }
      else {
        for (uVar9 = 0; uVar8 = uVar11 + uVar9, uVar8 < uVar12; uVar9 = uVar9 + 1) {
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar8 = (ulong)sel->sel_vector[uVar11 + uVar9];
          }
          if ((uVar4 >> (uVar9 & 0x3f) & 1) == 0) {
            bVar6 = false;
          }
          else {
            bVar6 = rdata[uVar11 + uVar9] < *ldata;
          }
          true_sel->sel_vector[iVar5] = (sel_t)uVar8;
          iVar5 = iVar5 + bVar6;
          false_sel->sel_vector[lVar10] = (sel_t)uVar8;
          lVar10 = lVar10 + (ulong)(bVar6 ^ 1);
        }
        uVar12 = uVar11 + uVar9;
      }
    }
    uVar7 = uVar7 + 1;
    uVar11 = uVar12;
  } while( true );
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}